

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFilesCommand.cxx
# Opt level: O0

string * __thiscall
cmInstallFilesCommand::FindInstallSource_abi_cxx11_
          (string *__return_storage_ptr__,cmInstallFilesCommand *this,char *name)

{
  bool bVar1;
  size_type sVar2;
  char *pcVar3;
  bool bVar4;
  allocator local_a1;
  string local_a0 [8];
  string ts;
  string local_78 [8];
  string tb;
  allocator local_41;
  string local_40;
  char *local_20;
  char *name_local;
  cmInstallFilesCommand *this_local;
  
  local_20 = name;
  name_local = (char *)this;
  this_local = (cmInstallFilesCommand *)__return_storage_ptr__;
  bVar1 = cmsys::SystemTools::FileIsFullPath(name);
  pcVar3 = local_20;
  tb.field_2._M_local_buf[0xb] = '\0';
  bVar4 = true;
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,pcVar3,&local_41);
    tb.field_2._M_local_buf[0xb] = '\x01';
    sVar2 = cmGeneratorExpression::Find(&local_40);
    bVar4 = sVar2 == 0;
  }
  if ((tb.field_2._M_local_buf[0xb] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  if (!bVar1) {
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  pcVar3 = local_20;
  if (bVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,pcVar3,(allocator *)(tb.field_2._M_local_buf + 10));
    std::allocator<char>::~allocator((allocator<char> *)(tb.field_2._M_local_buf + 10));
  }
  else {
    pcVar3 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,pcVar3,(allocator *)(ts.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(ts.field_2._M_local_buf + 0xf));
    std::__cxx11::string::operator+=(local_78,"/");
    std::__cxx11::string::operator+=(local_78,local_20);
    pcVar3 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,pcVar3,&local_a1);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    std::__cxx11::string::operator+=(local_a0,"/");
    std::__cxx11::string::operator+=(local_a0,local_20);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar4 = cmsys::SystemTools::FileExists(pcVar3);
    if (bVar4) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,local_78);
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      bVar4 = cmsys::SystemTools::FileExists(pcVar3);
      if (bVar4) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,local_a0);
      }
      else {
        std::__cxx11::string::string((string *)__return_storage_ptr__,local_78);
      }
    }
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallFilesCommand::FindInstallSource(const char* name) const
{
  if(cmSystemTools::FileIsFullPath(name) ||
     cmGeneratorExpression::Find(name) == 0)
    {
    // This is a full path.
    return name;
    }

  // This is a relative path.
  std::string tb = this->Makefile->GetCurrentBinaryDirectory();
  tb += "/";
  tb += name;
  std::string ts = this->Makefile->GetCurrentSourceDirectory();
  ts += "/";
  ts += name;

  if(cmSystemTools::FileExists(tb.c_str()))
    {
    // The file exists in the binary tree.  Use it.
    return tb;
    }
  else if(cmSystemTools::FileExists(ts.c_str()))
    {
    // The file exists in the source tree.  Use it.
    return ts;
    }
  else
    {
    // The file doesn't exist.  Assume it will be present in the
    // binary tree when the install occurs.
    return tb;
    }
}